

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_nextInputSizeHint(ZSTD_CCtx *cctx)

{
  size_t sVar1;
  
  if ((cctx->appliedParams).inBufferMode == ZSTD_bm_stable) {
    return cctx->blockSize - cctx->stableIn_notConsumed;
  }
  sVar1 = cctx->inBuffTarget - cctx->inBuffPos;
  if (sVar1 != 0) {
    return sVar1;
  }
  return cctx->blockSize;
}

Assistant:

static size_t ZSTD_nextInputSizeHint(const ZSTD_CCtx* cctx)
{
    if (cctx->appliedParams.inBufferMode == ZSTD_bm_stable) {
        return cctx->blockSize - cctx->stableIn_notConsumed;
    }
    assert(cctx->appliedParams.inBufferMode == ZSTD_bm_buffered);
    {   size_t hintInSize = cctx->inBuffTarget - cctx->inBuffPos;
        if (hintInSize==0) hintInSize = cctx->blockSize;
        return hintInSize;
    }
}